

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  InnerProduct_x86_avx *in_RSI;
  long in_RDI;
  bool bVar3;
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_00000dd8;
  int in_stack_00000de4;
  Mat *in_stack_00000de8;
  Mat *in_stack_00000df0;
  Mat *in_stack_00000df8;
  Mat *in_stack_00000e00;
  Mat *in_stack_000015f8;
  int in_stack_00001604;
  Mat *in_stack_00001608;
  Mat *in_stack_00001610;
  Mat *in_stack_00001618;
  Mat *in_stack_00001620;
  Option *in_stack_000020d0;
  Mat *in_stack_000020d8;
  Mat *in_stack_000020e0;
  InnerProduct_x86_avx *in_stack_000020e8;
  Option *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  void *local_158;
  size_t sStack_150;
  size_t sStack_148;
  undefined8 uStack_140;
  Allocator *local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  _func_int **local_118;
  int *local_110;
  long *local_f8;
  int local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  int local_e0;
  size_type local_d8;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_94;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  if (((in_RCX->field_0x1e & 1) != 0) && (*(int *)(in_RDI + 0xdc) != 0)) {
    iVar1 = forward_int8_x86(in_stack_000020e8,in_stack_000020e0,in_stack_000020d8,in_stack_000020d0
                            );
    return iVar1;
  }
  iVar2 = cpu_support_x86_f16c();
  if ((iVar2 != 0) && (((ulong)in_RCX->allocator & 0x10000) != 0)) {
    iVar1 = forward_fp16s(in_RSI,in_RDX,in_RCX,
                          (Option *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    return iVar1;
  }
  if (((in_RSI->super_InnerProduct).super_Layer.typeindex == 2) &&
     (*(int *)&(in_RSI->super_InnerProduct).super_Layer.field_0x2c ==
      *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0))) {
    local_c8._0_1_ = (in_RSI->super_InnerProduct).super_Layer.support_tensor_storage;
    local_c8._1_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_00;
    local_c8._2_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_0;
    local_c8._3_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_1;
    local_c8._4_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_2;
    local_c8._5_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_3;
    local_c8._6_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_4;
    local_c8._7_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_5;
    local_cc._0_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_6;
    local_cc._1_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_7;
    local_cc._2_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_8;
    local_cc._3_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_9;
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),iVar1,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    bVar3 = true;
    if (in_RDX->data != (void *)0x0) {
      bVar3 = in_RDX->cstep * (long)in_RDX->c == 0;
    }
    if (!bVar3) {
      innerproduct_gemm_sse
                (in_stack_00001620,in_stack_00001618,in_stack_00001610,in_stack_00001608,
                 in_stack_00001604,in_stack_000015f8,in_stack_fffffffffffffe10);
      return 0;
    }
    return -100;
  }
  local_118 = (in_RSI->super_InnerProduct).super_Layer._vptr_Layer;
  local_110 = *(int **)&(in_RSI->super_InnerProduct).super_Layer.one_blob_only;
  local_f8 = (long *)(in_RSI->super_InnerProduct).super_Layer.userdata;
  local_f0 = (in_RSI->super_InnerProduct).super_Layer.typeindex;
  local_ec = *(undefined4 *)&(in_RSI->super_InnerProduct).super_Layer.field_0x2c;
  local_e8 = *(undefined4 *)&(in_RSI->super_InnerProduct).super_Layer.type;
  local_e4 = *(undefined4 *)&(in_RSI->super_InnerProduct).super_Layer.type.field_0x4;
  local_e0 = (int)(in_RSI->super_InnerProduct).super_Layer.type._M_string_length;
  local_d8 = (in_RSI->super_InnerProduct).super_Layer.type.field_2._M_allocated_capacity;
  if (local_110 != (int *)0x0) {
    LOCK();
    *local_110 = *local_110 + 1;
    UNLOCK();
  }
  if ((in_RSI->super_InnerProduct).super_Layer.typeindex != 1) {
    local_158 = in_RCX->data;
    sStack_148 = in_RCX->elemsize;
    uStack_140 = *(undefined8 *)&in_RCX->elempack;
    local_138 = in_RCX->allocator;
    uStack_130._0_4_ = in_RCX->dims;
    uStack_130._4_4_ = in_RCX->w;
    uStack_128._0_4_ = in_RCX->h;
    uStack_128._4_4_ = in_RCX->d;
    uStack_120 = *(undefined8 *)&in_RCX->c;
    sStack_150 = in_RCX->elemsize;
    (**(code **)(**(long **)(in_RDI + 0x250) + 0x38))
              (*(long **)(in_RDI + 0x250),in_RSI,&local_118,&local_158);
    if (local_118 == (_func_int **)0x0 || local_d8 * (long)local_e0 == 0) {
      local_94 = -100;
      goto LAB_00de660b;
    }
    in_stack_fffffffffffffe47 = 0;
  }
  if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
    if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
      in_stack_fffffffffffffe34 = 8;
    }
    else {
      in_stack_fffffffffffffe34 = 1;
      if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
        in_stack_fffffffffffffe34 = 4;
      }
    }
  }
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe3c,
              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),iVar1,
              (Allocator *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  bVar3 = true;
  if (in_RDX->data != (void *)0x0) {
    bVar3 = in_RDX->cstep * (long)in_RDX->c == 0;
  }
  if (bVar3) {
    local_94 = -100;
  }
  else {
    innerproduct_sse(in_stack_00000e00,in_stack_00000df8,in_stack_00000df0,in_stack_00000de8,
                     in_stack_00000de4,in_stack_00000dd8,in_stack_fffffffffffffe10);
    local_94 = 0;
  }
LAB_00de660b:
  if (local_110 != (int *)0x0) {
    LOCK();
    iVar1 = *local_110;
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_f8 == (long *)0x0) {
        if (local_118 != (_func_int **)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
      }
    }
  }
  return local_94;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}